

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O2

bool __thiscall cmQtAutoMocUic::CreateDirectories(cmQtAutoMocUic *this)

{
  string *path;
  bool bVar1;
  allocator<char> local_41;
  string local_40;
  
  path = &(this->BaseConst_).AutogenIncludeDir;
  bVar1 = cmsys::SystemTools::MakeDirectory(path,(mode_t *)0x0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Could not create directory.",&local_41);
    cmQtAutoGenerator::Logger::ErrorFile(&this->Logger_,GEN,path,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return bVar1;
}

Assistant:

bool cmQtAutoMocUic::CreateDirectories()
{
  // Create AUTOGEN include directory
  if (!cmSystemTools::MakeDirectory(BaseConst().AutogenIncludeDir)) {
    Log().ErrorFile(GenT::GEN, BaseConst().AutogenIncludeDir,
                    "Could not create directory.");
    return false;
  }
  return true;
}